

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_StopStream(PaStream *stream)

{
  int iVar1;
  int iVar2;
  PaError PVar3;
  
  if (initializationCount_ == 0) {
    iVar2 = -10000;
  }
  else {
    iVar2 = -0x2704;
    if ((stream != (PaStream *)0x0) && (*stream == 0x18273645)) {
      iVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
      if (iVar1 == 0) {
        PVar3 = (**(code **)(*(long *)((long)stream + 0x10) + 0x10))(stream);
        return PVar3;
      }
      iVar2 = -0x26ff;
      if (iVar1 != 1) {
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

PaError Pa_StopStream( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_StopStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = PA_STREAM_INTERFACE(stream)->Stop( stream );
        }
        else if( result == 1 )
        {
            result = paStreamIsStopped;
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_StopStream", result );

    return result;
}